

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
::find_or_prepare_insert_non_soo<char_const*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          *this,char **key)

{
  ctrl_t *pcVar1;
  char *__s;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  ctrl_t cVar5;
  ctrl_t cVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  ctrl_t cVar33;
  ctrl_t cVar34;
  ctrl_t cVar35;
  ctrl_t cVar36;
  undefined1 uVar37;
  bool bVar38;
  ushort uVar39;
  size_t sVar40;
  uint64_t uVar41;
  ctrl_t *pcVar42;
  slot_type *psVar43;
  uint uVar44;
  ulong uVar45;
  CommonFields *common;
  PolicyFunctions *in_R9;
  uchar *bytes;
  size_t sVar46;
  ulong uVar47;
  undefined4 uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  __m128i match;
  undefined1 auVar51 [16];
  iterator iVar52;
  FindInfo target;
  ulong local_90;
  char **local_68;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *local_60;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  ctrl_t cStack_54;
  ctrl_t cStack_53;
  ctrl_t cStack_52;
  ctrl_t cStack_51;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  undefined1 local_48 [16];
  
  if (*(long *)this == 1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xf66,
                  "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>, K = const char *]"
                 );
  }
  if (*(long *)this != 0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::prefetch_heap_block
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)this);
    __s = *key;
    sVar40 = strlen(__s);
    uVar41 = hash_internal::MixingHashState::CombineContiguousImpl
                       (&hash_internal::MixingHashState::kSeed,__s,sVar40);
    uVar2 = *(ulong *)this;
    if ((uVar2 + 1 & uVar2) != 0) {
      __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x14c,
                    "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                   );
    }
    uVar45 = (uVar41 ^ sVar40) * -0x234dd359734ecb13;
    common = (CommonFields *)
             (uVar45 >> 0x38 | (uVar45 & 0xff000000000000) >> 0x28 |
              (uVar45 & 0xff0000000000) >> 0x18 | (uVar45 & 0xff00000000) >> 8 |
              (uVar45 & 0xff000000) << 8 | (uVar45 & 0xff0000) << 0x18 | (uVar45 & 0xff00) << 0x28 |
             uVar45 << 0x38);
    uVar47 = (ulong)common >> 7 ^ *(ulong *)(this + 0x10) >> 0xc;
    pcVar42 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)this);
    uVar37 = (undefined1)(uVar45 >> 0x38);
    auVar49 = ZEXT216(CONCAT11(uVar37,uVar37) & 0x7f7f);
    auVar49 = pshuflw(auVar49,auVar49,0);
    uVar48 = auVar49._0_4_;
    auVar49._4_4_ = uVar48;
    auVar49._0_4_ = uVar48;
    auVar49._8_4_ = uVar48;
    auVar49._12_4_ = uVar48;
    local_90 = 0;
    while( true ) {
      uVar47 = uVar47 & uVar2;
      pcVar1 = pcVar42 + uVar47;
      auVar50[0] = -(auVar49[0] == *pcVar1);
      auVar50[1] = -(auVar49[1] == pcVar1[1]);
      auVar50[2] = -(auVar49[2] == pcVar1[2]);
      auVar50[3] = -(auVar49[3] == pcVar1[3]);
      auVar50[4] = -(auVar49[4] == pcVar1[4]);
      auVar50[5] = -(auVar49[5] == pcVar1[5]);
      auVar50[6] = -(auVar49[6] == pcVar1[6]);
      auVar50[7] = -(auVar49[7] == pcVar1[7]);
      auVar50[8] = -(auVar49[8] == pcVar1[8]);
      auVar50[9] = -(auVar49[9] == pcVar1[9]);
      auVar50[10] = -(auVar49[10] == pcVar1[10]);
      auVar50[0xb] = -(auVar49[0xb] == pcVar1[0xb]);
      auVar50[0xc] = -(auVar49[0xc] == pcVar1[0xc]);
      auVar50[0xd] = -(auVar49[0xd] == pcVar1[0xd]);
      auVar50[0xe] = -(auVar49[0xe] == pcVar1[0xe]);
      auVar50[0xf] = -(auVar49[0xf] == pcVar1[0xf]);
      uVar39 = (ushort)(SUB161(auVar50 >> 7,0) & 1) | (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe | (ushort)(auVar50[0xf] >> 7) << 0xf;
      uVar44 = (uint)uVar39;
      cVar21 = *pcVar1;
      cVar22 = pcVar1[1];
      cVar23 = pcVar1[2];
      cVar24 = pcVar1[3];
      cVar25 = pcVar1[4];
      cVar26 = pcVar1[5];
      cVar27 = pcVar1[6];
      cVar28 = pcVar1[7];
      cVar29 = pcVar1[8];
      cVar30 = pcVar1[9];
      cVar31 = pcVar1[10];
      cVar32 = pcVar1[0xb];
      cVar33 = pcVar1[0xc];
      cVar34 = pcVar1[0xd];
      cVar35 = pcVar1[0xe];
      cVar36 = pcVar1[0xf];
      cVar5 = local_58;
      cVar6 = cStack_57;
      cVar7 = cStack_56;
      cVar8 = cStack_55;
      cVar9 = cStack_54;
      cVar10 = cStack_53;
      cVar11 = cStack_52;
      cVar12 = cStack_51;
      cVar13 = cStack_50;
      cVar14 = cStack_4f;
      cVar15 = cStack_4e;
      cVar16 = cStack_4d;
      cVar17 = cStack_4c;
      cVar18 = cStack_4b;
      cVar19 = cStack_4a;
      cVar20 = cStack_49;
      while (cStack_49 = cVar36, cStack_4a = cVar35, cStack_4b = cVar34, cStack_4c = cVar33,
            cStack_4d = cVar32, cStack_4e = cVar31, cStack_4f = cVar30, cStack_50 = cVar29,
            cStack_51 = cVar28, cStack_52 = cVar27, cStack_53 = cVar26, cStack_54 = cVar25,
            cStack_55 = cVar24, cStack_56 = cVar23, cStack_57 = cVar22, local_58 = cVar21,
            uVar39 != 0) {
        uVar3 = 0;
        if (uVar44 != 0) {
          for (; (uVar44 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        local_68 = key;
        local_60 = this;
        local_48 = auVar49;
        psVar43 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                *)this);
        sVar46 = uVar3 + uVar47 & uVar2;
        bVar38 = EqualElement<char_const*>::operator()(&local_68,psVar43 + sVar46,psVar43 + sVar46);
        if (bVar38) {
          bVar38 = false;
          goto LAB_00d9a257;
        }
        uVar39 = (ushort)(uVar44 - 1) & (ushort)uVar44;
        uVar44 = CONCAT22((short)(uVar44 - 1 >> 0x10),uVar39);
        auVar49 = local_48;
        cVar21 = local_58;
        cVar22 = cStack_57;
        cVar23 = cStack_56;
        cVar24 = cStack_55;
        cVar25 = cStack_54;
        cVar26 = cStack_53;
        cVar27 = cStack_52;
        cVar28 = cStack_51;
        cVar29 = cStack_50;
        cVar30 = cStack_4f;
        cVar31 = cStack_4e;
        cVar32 = cStack_4d;
        cVar33 = cStack_4c;
        cVar34 = cStack_4b;
        cVar35 = cStack_4a;
        cVar36 = cStack_49;
        cVar5 = local_58;
        cVar6 = cStack_57;
        cVar7 = cStack_56;
        cVar8 = cStack_55;
        cVar9 = cStack_54;
        cVar10 = cStack_53;
        cVar11 = cStack_52;
        cVar12 = cStack_51;
        cVar13 = cStack_50;
        cVar14 = cStack_4f;
        cVar15 = cStack_4e;
        cVar16 = cStack_4d;
        cVar17 = cStack_4c;
        cVar18 = cStack_4b;
        cVar19 = cStack_4a;
        cVar20 = cStack_49;
      }
      auVar51[0] = -(local_58 == kEmpty);
      auVar51[1] = -(cStack_57 == kEmpty);
      auVar51[2] = -(cStack_56 == kEmpty);
      auVar51[3] = -(cStack_55 == kEmpty);
      auVar51[4] = -(cStack_54 == kEmpty);
      auVar51[5] = -(cStack_53 == kEmpty);
      auVar51[6] = -(cStack_52 == kEmpty);
      auVar51[7] = -(cStack_51 == kEmpty);
      auVar51[8] = -(cStack_50 == kEmpty);
      auVar51[9] = -(cStack_4f == kEmpty);
      auVar51[10] = -(cStack_4e == kEmpty);
      auVar51[0xb] = -(cStack_4d == kEmpty);
      auVar51[0xc] = -(cStack_4c == kEmpty);
      auVar51[0xd] = -(cStack_4b == kEmpty);
      auVar51[0xe] = -(cStack_4a == kEmpty);
      auVar51[0xf] = -(cStack_49 == kEmpty);
      uVar39 = (ushort)(SUB161(auVar51 >> 7,0) & 1) | (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe | (ushort)(auVar51[0xf] >> 7) << 0xf;
      sVar46 = *(size_t *)this;
      local_58 = cVar5;
      cStack_57 = cVar6;
      cStack_56 = cVar7;
      cStack_55 = cVar8;
      cStack_54 = cVar9;
      cStack_53 = cVar10;
      cStack_52 = cVar11;
      cStack_51 = cVar12;
      cStack_50 = cVar13;
      cStack_4f = cVar14;
      cStack_4e = cVar15;
      cStack_4d = cVar16;
      cStack_4c = cVar17;
      cStack_4b = cVar18;
      cStack_4a = cVar19;
      cStack_49 = cVar20;
      if (uVar39 != 0) break;
      if (sVar46 == 0) goto LAB_00d9a283;
      uVar47 = uVar47 + local_90 + 0x10;
      local_90 = local_90 + 0x10;
      if (sVar46 < local_90) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>, K = const char *]"
                     );
      }
    }
    if (sVar46 != 0) {
      pcVar42 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)this);
      bVar38 = ShouldInsertBackwardsForDebug(sVar46,(size_t)common,pcVar42);
      if (bVar38) {
        uVar4 = 0xf;
        if (uVar39 != 0) {
          for (; uVar39 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar44 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar44 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = local_90;
      sVar46 = PrepareInsertNonSoo((container_internal *)this,common,uVar44 + uVar47 & uVar2,target,
                                   in_R9);
      bVar38 = true;
LAB_00d9a257:
      iVar52 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)this,sVar46);
      __return_storage_ptr__->first = iVar52;
      __return_storage_ptr__->second = bVar38;
      return __return_storage_ptr__;
    }
  }
LAB_00d9a283:
  __assert_fail("cap >= kDefaultCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb75,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>]"
               );
}

Assistant:

size_t capacity() const { return capacity_; }